

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_BitMask.cpp
# Opt level: O2

void anon_unknown.dwarf_90a02::run(void)

{
  EVP_PKEY_CTX *pEVar1;
  size_t sVar2;
  RefCount *pRVar3;
  Box<(anonymous_namespace)::MyClass4> *this;
  Ptr<(anonymous_namespace)::IMyInterface> local_78;
  Ptr<(anonymous_namespace)::MyClass2> p;
  Ptr<(anonymous_namespace)::IMyInterface> p3;
  Ptr<(anonymous_namespace)::IMyInterface> p2;
  Ptr<(anonymous_namespace)::IMyInterface> local_38;
  
  run_Buf();
  pEVar1 = (EVP_PKEY_CTX *)axl::mem::allocate(0x18);
  *(undefined8 *)(pEVar1 + 8) = 0;
  *(undefined4 *)(pEVar1 + 0x10) = 0;
  *(undefined4 *)(pEVar1 + 0x14) = 1;
  *(undefined ***)pEVar1 = &PTR__MyClass2_0014a508;
  puts("MyClass2::MyClass2 ()");
  *(code **)(pEVar1 + 8) = axl::mem::deallocate;
  p.m_p = (MyClass2 *)0x0;
  p.m_refCount = (RefCount *)0x0;
  axl::rc::Ptr<(anonymous_namespace)::MyClass2>::copy(&p,pEVar1,pEVar1);
  pRVar3 = p.m_refCount;
  p2.m_refCount = (RefCount *)0x0;
  if (p.m_refCount != (RefCount *)0x0) {
    LOCK();
    (p.m_refCount)->m_weakRefCount = (p.m_refCount)->m_weakRefCount + 1;
    UNLOCK();
    p2.m_refCount = p.m_refCount;
  }
  p2.m_p = (IMyInterface *)p.m_p;
  axl::rc::Ptr<(anonymous_namespace)::MyClass2>::clear(&p);
  p3.m_p = (IMyInterface *)0x0;
  p3.m_refCount = (RefCount *)0x0;
  if ((pRVar3 == (RefCount *)0x0) ||
     (sVar2 = axl::rc::RefCount::addRefByWeakPtr(pRVar3), sVar2 == 0)) {
    pRVar3 = (RefCount *)0x0;
    pEVar1 = (EVP_PKEY_CTX *)0x0;
  }
  else {
    p3.m_p = p2.m_p;
    p3.m_refCount = pRVar3;
    pEVar1 = (EVP_PKEY_CTX *)p2.m_p;
  }
  axl::rc::Ptr<(anonymous_namespace)::MyClass2>::copy(&p,pEVar1,(EVP_PKEY_CTX *)pRVar3);
  axl::rc::Ptr<(anonymous_namespace)::MyClass2>::~Ptr((Ptr<(anonymous_namespace)::MyClass2> *)&p3);
  axl::rc::WeakPtr<(anonymous_namespace)::MyClass2>::~WeakPtr
            ((WeakPtr<(anonymous_namespace)::MyClass2> *)&p2);
  axl::rc::Ptr<(anonymous_namespace)::MyClass2>::~Ptr(&p);
  p.m_p = (MyClass2 *)0x0;
  p.m_refCount = (RefCount *)0x0;
  p2.m_p = (IMyInterface *)0x0;
  p2.m_refCount = (RefCount *)0x0;
  p3.m_p = (IMyInterface *)0x0;
  p3.m_refCount = (RefCount *)0x0;
  pRVar3 = (RefCount *)axl::mem::allocate(0x188);
  pRVar3->m_freeFunc = (FreeFunc *)0x0;
  pRVar3->m_refCount = 0;
  pRVar3->m_weakRefCount = 1;
  pRVar3->_vptr_RefCount = (_func_int **)&PTR__MySuperContainer_0014a540;
  pRVar3[1]._vptr_RefCount = (_func_int **)&PTR_getChild_0014a578;
  axl::rc::Child<(anonymous_namespace)::MyContainer,_0UL>::Child
            ((Child<(anonymous_namespace)::MyContainer,_0UL> *)&pRVar3[1].m_freeFunc,pRVar3);
  axl::rc::Child<(anonymous_namespace)::MyContainer,_0UL>::Child
            ((Child<(anonymous_namespace)::MyContainer,_0UL> *)(pRVar3 + 8),pRVar3);
  axl::rc::Child<axl::rc::Box<(anonymous_namespace)::MyClass4>,_0UL>::Child
            ((Child<axl::rc::Box<(anonymous_namespace)::MyClass4>,_0UL> *)&pRVar3[0xe].m_refCount,
             pRVar3);
  puts("MySuperContainer::MySuperContainer ()");
  pRVar3->m_freeFunc = axl::mem::deallocate;
  local_78.m_p = (IMyInterface *)0x0;
  local_78.m_refCount = (RefCount *)0x0;
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::copy
            (&local_78,(EVP_PKEY_CTX *)(pRVar3 + 1),(EVP_PKEY_CTX *)pRVar3);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::operator=
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&p,&local_78);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::~Ptr(&local_78);
  (*((p.m_p)->super_RefCount)._vptr_RefCount[1])();
  (*((p.m_p)->super_RefCount)._vptr_RefCount[2])();
  (**((p.m_p)->super_RefCount)._vptr_RefCount)(&local_78,p.m_p,1);
  (*(local_78.m_p)->_vptr_IMyInterface[1])();
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::~Ptr(&local_78);
  (**((p.m_p)->super_RefCount)._vptr_RefCount)(&local_78,p.m_p,1);
  (*(local_78.m_p)->_vptr_IMyInterface[2])();
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::~Ptr(&local_78);
  (**((p.m_p)->super_RefCount)._vptr_RefCount)(&local_78,p.m_p,2);
  (*(local_78.m_p)->_vptr_IMyInterface[1])();
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::~Ptr(&local_78);
  (**((p.m_p)->super_RefCount)._vptr_RefCount)(&local_78,p.m_p,2);
  (*(local_78.m_p)->_vptr_IMyInterface[2])();
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::~Ptr(&local_78);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&p);
  this = (Box<(anonymous_namespace)::MyClass4> *)axl::mem::allocate(0x20);
  axl::rc::Box<(anonymous_namespace)::MyClass4>::Box(this);
  (this->super_RefCount).m_freeFunc = axl::mem::deallocate;
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::
  Ptr<axl::rc::Box<(anonymous_namespace)::MyClass4>>(&local_78,this);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::operator=(&p3,&local_78);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::~Ptr(&local_78);
  pRVar3 = p3.m_refCount;
  local_78.m_refCount = (RefCount *)0x0;
  if (p3.m_refCount != (RefCount *)0x0) {
    LOCK();
    (p3.m_refCount)->m_weakRefCount = (p3.m_refCount)->m_weakRefCount + 1;
    UNLOCK();
    local_78.m_refCount = p3.m_refCount;
  }
  local_78.m_p = p3.m_p;
  (*(p3.m_p)->_vptr_IMyInterface[2])();
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::clear(&p3);
  local_38.m_p = (IMyInterface *)0x0;
  local_38.m_refCount = (RefCount *)0x0;
  if ((pRVar3 != (RefCount *)0x0) &&
     (sVar2 = axl::rc::RefCount::addRefByWeakPtr(pRVar3), sVar2 != 0)) {
    local_38.m_p = local_78.m_p;
    local_38.m_refCount = pRVar3;
  }
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::operator=
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&p,&local_38);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::~Ptr(&local_38);
  axl::rc::WeakPtr<(anonymous_namespace)::IMyInterface>::~WeakPtr
            ((WeakPtr<(anonymous_namespace)::IMyInterface> *)&local_78);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::~Ptr(&p3);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::~Ptr(&p2);
  axl::rc::Ptr<(anonymous_namespace)::IMyInterface>::~Ptr
            ((Ptr<(anonymous_namespace)::IMyInterface> *)&p);
  return;
}

Assistant:

void run() {
	uint64_t lo64[][2] = {
		{ 0,  0x0000000000000000LL },
		{ 4,  0x000000000000000fLL },
		{ 8,  0x00000000000000ffLL },
		{ 12, 0x0000000000000fffLL },
		{ 16, 0x000000000000ffffLL },
		{ 31, 0x000000007fffffffLL },
		{ 32, 0x00000000ffffffffLL },
		{ 52, 0x000fffffffffffffLL },
		{ 56, 0x00ffffffffffffffLL },
		{ 60, 0x0fffffffffffffffLL },
		{ 63, 0x7fffffffffffffffLL },
		{ 64, 0xffffffffffffffffLL },
	};

	for (size_t i = 0; i < countof(lo64); i++) {
		uint64_t shift = lo64[i][0];
		uint64_t expected = lo64[i][1];
		uint64_t result = sl::getLoBitmask64(shift);
		printf("getLoBitmask64(%llu): 0x%016llx\n", shift, result);
		TEST_ASSERT(result == expected);
	}

	uint64_t hi64[][2] = {
		{ 0,  0xffffffffffffffffLL },
		{ 4,  0xfffffffffffffff0LL },
		{ 8,  0xffffffffffffff00LL },
		{ 12, 0xfffffffffffff000LL },
		{ 16, 0xffffffffffff0000LL },
		{ 31, 0xffffffff80000000LL },
		{ 32, 0xffffffff00000000LL },
		{ 52, 0xfff0000000000000LL },
		{ 56, 0xff00000000000000LL },
		{ 60, 0xf000000000000000LL },
		{ 63, 0x8000000000000000LL },
		{ 64, 0x0000000000000000LL },
	};

	for (size_t i = 0; i < countof(hi64); i++) {
		uint64_t shift = hi64[i][0];
		uint64_t expected = hi64[i][1];
		uint64_t result = sl::getHiBitmask64(shift);
		printf("getHiBitmask64(%llu): 0x%016llx\n", shift, result);
		TEST_ASSERT(result == expected);
	}

	uint32_t lo32[][2] = {
		{ 0,  0x00000000 },
		{ 4,  0x0000000f },
		{ 8,  0x000000ff },
		{ 12, 0x00000fff },
		{ 16, 0x0000ffff },
		{ 31, 0x7fffffff },
		{ 32, 0xffffffff },
	};

	for (size_t i = 0; i < countof(lo32); i++) {
		uint32_t shift = lo32[i][0];
		uint32_t expected = lo32[i][1];
		uint32_t result = sl::getLoBitmask32(shift);
		printf("getLoBitmask32(%llu): 0x%08x\n", shift, result);
		TEST_ASSERT(result == expected);
	}

	uint32_t hi32[][2] = {
		{ 0,  0xffffffff },
		{ 4,  0xfffffff0 },
		{ 8,  0xffffff00 },
		{ 12, 0xfffff000 },
		{ 16, 0xffff0000 },
		{ 31, 0x80000000 },
		{ 32, 0x00000000 },
	};

	for (size_t i = 0; i < countof(hi32); i++) {
		uint64_t shift = hi32[i][0];
		uint64_t expected = hi32[i][1];
		uint64_t result = sl::getHiBitmask32(shift);
		printf("getHiBitmask32(%llu): 0x%08x\n", shift, result);
		TEST_ASSERT(result == expected);
	}

	uint16_t lo16[][2] = {
		{ 0,  0x0000 },
		{ 4,  0x000f },
		{ 8,  0x00ff },
		{ 12, 0x0fff },
		{ 16, 0xffff },
	};

	for (size_t i = 0; i < countof(lo16); i++) {
		uint16_t shift = lo16[i][0];
		uint16_t expected = lo16[i][1];
		uint16_t result = sl::getLoBitmask16(shift);
		printf("getLoBitmask16(%llu): 0x%08x\n", shift, result);
		TEST_ASSERT(result == expected);
	}

	uint16_t hi16[][2] = {
		{ 0,  0xffff },
		{ 4,  0xfff0 },
		{ 8,  0xff00 },
		{ 12, 0xf000 },
		{ 16, 0x0000 },
	};

	for (size_t i = 0; i < countof(hi16); i++) {
		uint64_t shift = hi16[i][0];
		uint64_t expected = hi16[i][1];
		uint64_t result = sl::getHiBitmask16(shift);
		printf("getHiBitmask16(%llu): 0x%08x\n", shift, result);
		TEST_ASSERT(result == expected);
	}

	uint8_t lo8[][2] = {
		{ 0, 0x00 },
		{ 3, 0x07 },
		{ 4, 0x0f },
		{ 7, 0x7f },
		{ 8, 0xff },
	};

	for (size_t i = 0; i < countof(lo8); i++) {
		uint8_t shift = lo8[i][0];
		uint8_t expected = lo8[i][1];
		uint8_t result = sl::getLoBitmask8(shift);
		printf("getLoBitmask8(%llu): 0x%08x\n", shift, result);
		TEST_ASSERT(result == expected);
	}

	uint8_t hi8[][2] = {
		{ 0, 0xff },
		{ 3, 0xf8 },
		{ 4, 0xf0 },
		{ 7, 0x80 },
		{ 8, 0x00 },
	};

	for (size_t i = 0; i < countof(hi8); i++) {
		uint64_t shift = hi8[i][0];
		uint64_t expected = hi8[i][1];
		uint64_t result = sl::getHiBitmask8(shift);
		printf("getHiBitmask8(%llu): 0x%08x\n", shift, result);
		TEST_ASSERT(result == expected);
	}
}